

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::Path(Path *this)

{
  Path *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,".");
  return;
}

Assistant:

Path::Path()
{
  m_path = ".";
}